

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

TargetType __thiscall
cmExportBuildFileGenerator::GetExportTargetType
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *target)

{
  cmGlobalGenerator *pcVar1;
  byte bVar2;
  TargetType TVar3;
  int iVar4;
  
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == OBJECT_LIBRARY) {
    pcVar1 = this->LG->GlobalGenerator;
    iVar4 = (*pcVar1->_vptr_cmGlobalGenerator[0x25])(pcVar1,0);
    bVar2 = (byte)iVar4 ^ 1;
    TVar3 = (uint)bVar2 + (uint)bVar2 * 2 + OBJECT_LIBRARY;
  }
  return TVar3;
}

Assistant:

cmStateEnums::TargetType cmExportBuildFileGenerator::GetExportTargetType(
  cmGeneratorTarget const* target) const
{
  cmStateEnums::TargetType targetType = target->GetType();
  // An object library exports as an interface library if we cannot
  // tell clients where to find the objects.  This is sufficient
  // to support transitive usage requirements on other targets that
  // use the object library.
  if (targetType == cmStateEnums::OBJECT_LIBRARY &&
      !this->LG->GetGlobalGenerator()->HasKnownObjectFileLocation(nullptr)) {
    targetType = cmStateEnums::INTERFACE_LIBRARY;
  }
  return targetType;
}